

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::KMHNGram::backward_impl
          (KMHNGram *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  Dim *in_RCX;
  long in_RDI;
  uint k;
  int j;
  int c;
  Index in_stack_fffffffffffffee0;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
  *in_stack_fffffffffffffef8;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
  *in_stack_ffffffffffffff00;
  Tensor *in_stack_ffffffffffffff08;
  undefined4 local_3c;
  undefined4 local_38;
  
  uVar1 = Dim::cols(in_RCX);
  for (local_38 = 0; local_38 < (int)uVar1; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < *(uint *)(in_RDI + 0x50); local_3c = local_3c + 1) {
      Tensor::operator*(in_stack_ffffffffffffff08);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::col
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      Tensor::operator*(in_stack_ffffffffffffff08);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::col
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,1,true>>
      ::operator+=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
  }
  return;
}

Assistant:

void KMHNGram::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
  const int c = dEdf.d.cols();
  for (int j = 0; j < c; ++j)
    for (unsigned k = 0; k < n; ++k)
      (*dEdxi).col(j+k) += (*dEdf).col(j);
}